

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O3

void __thiscall TPZGenSubStruct::SubStructure(TPZGenSubStruct *this)

{
  TPZGeoMesh *this_00;
  TPZGeoEl *this_01;
  TPZCompMesh *mesh;
  int64_t iVar1;
  int iVar2;
  int iVar3;
  TPZGeoEl **ppTVar4;
  long lVar5;
  TPZSubCompMesh *this_02;
  TPZCompEl **ppTVar6;
  long *plVar7;
  uint uVar8;
  TPZChunkVector<TPZGeoEl_*,_10> *this_03;
  ulong nelem;
  int iVar9;
  TPZCompEl *pTVar10;
  ulong uVar11;
  TPZCompElSide TVar12;
  TPZGeoElSide gelside;
  TPZSimpleTimer timeformakeallinternal;
  TPZCompElSide celside;
  TPZSimpleTimer timesubstructuring;
  string local_1b0;
  _func_int **local_190;
  TPZChunkVector<TPZGeoEl_*,_10> *local_188;
  ulong local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  _func_int **local_170;
  undefined1 local_168 [32];
  TPZCompElSide local_148 [10];
  TPZGeoElSide local_a8;
  TPZSimpleTimer local_90;
  
  TPZSimpleTimer::TPZSimpleTimer(&local_90);
  this_00 = ((this->fCMesh).fRef)->fPointer->fReference;
  uVar8 = (uint)(this_00->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (0 < (int)uVar8) {
    this_03 = &(this_00->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
    uVar11 = (ulong)(uVar8 & 0x7fffffff);
    nelem = 0;
    local_170 = (_func_int **)&PTR__TPZManVector_0181a690;
    local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&PTR__TPZGeoElSide_018f8760;
    local_190 = (_func_int **)&PTR__TPZVec_018142b0;
    local_188 = this_03;
    local_180 = uVar11;
    do {
      ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](this_03,nelem);
      this_01 = *ppTVar4;
      iVar2 = TPZGeoEl::Level(this_01);
      if (iVar2 == this->fSubstructLevel) {
        lVar5 = 0x28;
        do {
          *(undefined8 *)((long)&local_170 + lVar5) = 0;
          *(undefined4 *)(local_168 + lVar5) = 0xffffffff;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 200);
        local_168._8_8_ = local_148;
        local_168._16_8_ = 0;
        local_168._24_8_ = 0;
        local_168._0_8_ = local_170;
        iVar2 = (**(code **)(*(long *)this_01 + 0xf0))(this_01);
        local_1b0.field_2._M_allocated_capacity._0_4_ = iVar2 + -1;
        local_1b0._M_dataplus._M_p = (pointer)local_178;
        local_1b0._M_string_length = (size_type)this_01;
        TPZGeoMesh::ResetReference(this_00);
        TPZCompMesh::LoadReferences(((this->fCMesh).fRef)->fPointer);
        TPZGeoElSide::HigherLevelCompElementList2
                  ((TPZGeoElSide *)&local_1b0,(TPZStack<TPZCompElSide,_10> *)local_168,0,0);
        uVar11 = local_168._16_8_ & 0xffffffff;
        if (local_168._16_4_ == 0) {
          TVar12 = TPZGeoElSide::Reference((TPZGeoElSide *)&local_1b0);
          iVar2 = (int)local_a8.fGeoEl;
          pTVar10 = (TPZCompEl *)
                    CONCAT71(local_a8.super_TPZSavable._vptr_TPZSavable._1_7_,
                             local_a8.super_TPZSavable._vptr_TPZSavable._0_1_);
          if (pTVar10 == (TPZCompEl *)0x0) {
            uVar11 = 0;
          }
          else {
            (**(_func_int **)(local_168._0_8_ + 0x18))(local_168,local_168._16_8_ + 1,TVar12._8_8_);
            ((TPZCompElSide *)(local_168._8_8_ + (local_168._16_8_ - 1) * 0x10))->fEl = pTVar10;
            ((TPZCompElSide *)(local_168._8_8_ + (local_168._16_8_ - 1) * 0x10))->fSide = iVar2;
            uVar11 = 1;
          }
        }
        mesh = ((this->fCMesh).fRef)->fPointer;
        this_02 = (TPZSubCompMesh *)operator_new(0xa78);
        TPZSubCompMesh::TPZSubCompMesh(this_02,mesh);
        local_a8.super_TPZSavable._vptr_TPZSavable._0_1_ = 0x2a;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_a8,1);
        std::ostream::flush();
        if (0 < (int)uVar11) {
          lVar5 = 0;
          do {
            TPZCompElSide::Reference
                      (&local_a8,(TPZCompElSide *)((long)(TPZCompEl **)local_168._8_8_ + lVar5));
            iVar2 = TPZGeoElSide::Dimension(&local_a8);
            if (iVar2 == this->fDimension) {
              (**(code **)(*(long *)&this_02->super_TPZCompMesh + 200))
                        (this_02,mesh,
                         *(undefined8 *)
                          (*(long *)((long)(TPZCompEl **)local_168._8_8_ + lVar5) + 0x10));
            }
            lVar5 = lVar5 + 0x10;
          } while (uVar11 << 4 != lVar5);
        }
        (**(code **)(*(long *)&this_02->super_TPZCompMesh + 0x60))(this_02);
        uVar11 = local_180;
        this_03 = local_188;
        if ((TPZCompElSide *)local_168._8_8_ != local_148) {
          local_168._24_8_ = 0;
          local_168._0_8_ = local_190;
          if ((TPZCompElSide *)local_168._8_8_ != (TPZCompElSide *)0x0) {
            operator_delete__((void *)local_168._8_8_);
          }
        }
      }
      nelem = nelem + 1;
    } while (nelem != uVar11);
  }
  TPZSimpleTimer::ReturnTimeString_abi_cxx11_((string *)local_168,&local_90);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_168._0_8_,local_168._8_8_);
  if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  uVar8 = (uint)(((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>
                .fNElements;
  if (0 < (int)uVar8) {
    uVar11 = 0;
    do {
      ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,uVar11);
      pTVar10 = *ppTVar6;
      if ((pTVar10 != (TPZCompEl *)0x0) &&
         (iVar2 = (**(code **)(*(long *)pTVar10 + 0xb0))(pTVar10), iVar2 == 0)) goto LAB_014b9a34;
      uVar11 = uVar11 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar11);
    pTVar10 = (TPZCompEl *)0x0;
LAB_014b9a34:
    if ((pTVar10 != (TPZCompEl *)0x0) &&
       (iVar2 = (**(code **)(*(long *)pTVar10 + 0xa0))(pTVar10,0), 0 < (int)uVar8)) {
      uVar11 = 0;
      do {
        ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                              super_TPZChunkVector<TPZCompEl_*,_10>,uVar11);
        if (((*ppTVar6 != (TPZCompEl *)0x0) &&
            (plVar7 = (long *)__dynamic_cast(*ppTVar6,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo
                                             ,0x918), plVar7 != (long *)0x0)) &&
           (iVar3 = (**(code **)(*plVar7 + 0x180))(plVar7), 0 < iVar3)) {
          iVar9 = 0;
          do {
            lVar5 = (**(code **)(*plVar7 + 0x178))(plVar7,iVar9);
            if (lVar5 == iVar2) {
              (**(code **)(*plVar7 + 200))(plVar7,((this->fCMesh).fRef)->fPointer,pTVar10->fIndex);
              goto LAB_014b9b02;
            }
            iVar9 = iVar9 + 1;
          } while (iVar3 != iVar9);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uVar8 & 0x7fffffff));
    }
  }
LAB_014b9b02:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Making Internal",0xf);
  iVar1 = (((this->fCMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Make all Internal \n",0x13);
  TPZSimpleTimer::TPZSimpleTimer((TPZSimpleTimer *)local_168);
  (**(code **)(*(long *)((this->fCMesh).fRef)->fPointer + 0x78))();
  uVar8 = (uint)iVar1;
  if (0 < (int)uVar8) {
    uVar11 = 0;
    do {
      ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fCMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,uVar11);
      if ((*ppTVar6 != (TPZCompEl *)0x0) &&
         (plVar7 = (long *)__dynamic_cast(*ppTVar6,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,
                                          0x918), plVar7 != (long *)0x0)) {
        local_1b0._M_dataplus._M_p._0_1_ = 0x2d;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_1b0,1);
        std::ostream::flush();
        (**(code **)(*plVar7 + 0xa8))(plVar7);
      }
      uVar11 = uVar11 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," == Finished\n",0xd);
  (**(code **)(*(long *)((this->fCMesh).fRef)->fPointer + 0x88))();
  TPZSimpleTimer::ReturnTimeString_abi_cxx11_(&local_1b0,(TPZSimpleTimer *)local_168);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,
                    CONCAT44(local_1b0.field_2._M_allocated_capacity._4_4_,
                             local_1b0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  TPZSimpleTimer::~TPZSimpleTimer((TPZSimpleTimer *)local_168);
  TPZSimpleTimer::~TPZSimpleTimer(&local_90);
  return;
}

Assistant:

void TPZGenSubStruct::SubStructure()
{
	TPZSimpleTimer timesubstructuring; // init of timer for substructuring mesh
	
	TPZGeoMesh *gmesh = fCMesh->Reference();
	int nel = gmesh->NElements();
	int iel;
	for(iel=0; iel<nel; iel++)
	{
		TPZGeoEl *gel = gmesh->ElementVec()[iel];
		if(gel->Level() == this->fSubstructLevel)
		{
			TPZStack<TPZCompElSide> subels;
			TPZGeoElSide gelside(gel,gel->NSides()-1);
			gmesh->ResetReference();
			fCMesh->LoadReferences();
			gelside.HigherLevelCompElementList2(subels,0,0);
			int nelstack = subels.NElements();
			if(!nelstack)
			{
				TPZCompElSide celside = gelside.Reference();
				if(celside.Element()) 
				{
					subels.Push(celside);
					nelstack = 1;
				}
			}
			TPZCompMesh *cmesh = fCMesh.operator->();
			TPZSubCompMesh *submesh = new TPZSubCompMesh(*cmesh);
			std::cout << '*';
			std::cout.flush();
			int sub;
			for(sub=0; sub<nelstack; sub++)
			{
				if(subels[sub].Reference().Dimension() == fDimension)
				{
					submesh->TransferElement(cmesh,subels[sub].Element()->Index());
#ifdef PZDEBUG 
					submesh->VerifyDatastructureConsistency();
#endif
				}
			}
			submesh->ExpandSolution();
		}
	}
	
	std::cout << timesubstructuring.ReturnTimeString(); // end of timer for substructuring mesh
	
	// transfer the point load
	// find the point elements
	nel = fCMesh->NElements();
	TPZCompEl *celpoint = 0;
	for(iel=0; iel<nel; iel++)
	{
		TPZCompEl *cel = fCMesh->ElementVec()[iel];
		if(!cel) continue;
		if(cel->Dimension() == 0) 
		{
			celpoint = cel;
			break;
		}
	}
	if(celpoint)
	{
		int conindex = celpoint->ConnectIndex(0);
		for(iel=0; iel<nel; iel++)
		{
			TPZCompEl *cel = fCMesh->ElementVec()[iel];
			if(!cel) continue;
			TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(cel);
			if(!submesh) continue;
			int nc = submesh->NConnects();
			int ic;
			for(ic=0; ic<nc; ic++)
			{
				if(submesh->ConnectIndex(ic) == conindex)
				{
					submesh->TransferElement(fCMesh.operator->(),celpoint->Index());
					celpoint = 0;
					conindex = -1;
					break;
				}
			}
			if(!celpoint) break;
		}
	}
	
	//#define MAKEINTERNAL
#ifdef MAKEINTERNAL
	std::cout << "Making Internal";
	// make all nodes internal
	nel = fCMesh->NElements();
	
	std::cout << "Make all Internal \n";
	TPZSimpleTimer timeformakeallinternal; // init for timer
	fCMesh->ComputeNodElCon();
	for(iel=0; iel<nel; iel++)
	{
		TPZCompEl *cel = fCMesh->ElementVec()[iel];
		if(!cel) continue;
		TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(cel);
		if(!submesh) continue;
		std::cout << '-'; std::cout.flush();
		submesh->MakeAllInternal();
	}
	std::cout << " == Finished\n";
	fCMesh->CleanUpUnconnectedNodes();
	
	std::cout << timeformakeallinternal.ReturnTimeString();
#endif
}